

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myHashMap.h
# Opt level: O2

void __thiscall
myHashMap<wallet>::myHashMap
          (myHashMap<wallet> *this,uint tableSize,_func_uint_myString_ptr_uint *hashF)

{
  undefined8 *puVar1;
  ulong *puVar2;
  long lVar3;
  long lVar4;
  
  this->tableSize = tableSize;
  lVar4 = (ulong)tableSize * 0x28;
  puVar2 = (ulong *)operator_new__(lVar4 + 8);
  *puVar2 = (ulong)tableSize;
  if (tableSize != 0) {
    lVar3 = 0;
    do {
      *(undefined ***)((long)puVar2 + lVar3 + 8) = &PTR__linkedList_0010ec58;
      *(undefined4 *)((long)puVar2 + lVar3 + 0x20) = 0;
      puVar1 = (undefined8 *)((long)puVar2 + lVar3 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)puVar2 + lVar3 + 0x28) = 0;
      lVar3 = lVar3 + 0x28;
    } while (lVar4 - lVar3 != 0);
  }
  this->table = (myBucket_chain<wallet> *)(puVar2 + 1);
  this->hashFunc = hashF;
  return;
}

Assistant:

myHashMap(unsigned tableSize ,unsigned (*hashF)(const myString&, unsigned )) {

        this->tableSize = tableSize;

        this->table = new myBucket_chain<T>  [tableSize] ;

        this->hashFunc = hashF;

    }